

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

int __thiscall Pathie::Path::stat(Path *this,char *__file,stat *__buf)

{
  int iVar1;
  stat *__buf_00;
  ErrnoError *this_00;
  int *piVar2;
  string nstr;
  string local_38;
  
  __buf_00 = (stat *)malloc(0x90);
  utf8_to_filename(&local_38,&this->m_path);
  iVar1 = ::stat(local_38._M_dataplus._M_p,__buf_00);
  if (-1 < iVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    return (int)__buf_00;
  }
  this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  ErrnoError::ErrnoError(this_00,*piVar2);
  __cxa_throw(this_00,&ErrnoError::typeinfo,GlobError::~GlobError);
}

Assistant:

struct stat* Path::stat() const
{
  struct stat* s = (struct stat*) malloc(sizeof(struct stat));
  std::string nstr = native();

  if (::stat(nstr.c_str(), s) < 0)
    throw(Pathie::ErrnoError(errno));

  return s;
}